

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance)

{
  byte bVar1;
  PropertyId propertyId;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  RecyclableObject *object;
  Var newValue;
  Var instance_local;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  functionBody = GetFunctionBody(this);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  bVar1 = playout->inlineCacheIndex;
  object = VarTo<Js::RecyclableObject>(instance);
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  newValue = GetReg<unsigned_char>(this,playout->Value);
  Js::JavascriptOperators::PatchInitValue<false,Js::InlineCache>
            (functionBody,inlineCache,(uint)bVar1,object,propertyId,newValue);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoInitProperty_NoFastPath(unaligned T* playout, Var instance)
    {
        JavascriptOperators::PatchInitValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value));
    }